

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

Index wasm::Properties::getAlmostSignExtBits(Expression *curr,Index *extraLeftShifts)

{
  char *pcVar1;
  uint uVar2;
  Index IVar3;
  uint uVar4;
  char *pcVar5;
  
  if ((curr->_id == BinaryId) && (pcVar5 = (char *)curr[1].type.id, *pcVar5 == '\x10')) {
    pcVar5 = *(char **)(pcVar5 + 0x20);
    if (*pcVar5 == '\x0e') {
      pcVar1 = *(char **)(curr + 2);
      if (*(long *)(pcVar5 + 8) == 3) {
        if (*(long *)(pcVar5 + 0x20) != 3) goto LAB_009d7084;
        uVar4 = *(uint *)(pcVar5 + 0x10) & 0x3f;
      }
      else {
        if (*(long *)(pcVar5 + 8) != 2) goto LAB_009d704d;
        if (*(long *)(pcVar5 + 0x20) != 2) goto LAB_009d7065;
        uVar4 = *(uint *)(pcVar5 + 0x10) & 0x1f;
      }
      if (*pcVar1 == '\x0e') {
        if (*(long *)(pcVar1 + 8) == 3) {
          if (*(long *)(pcVar1 + 0x20) != 3) {
LAB_009d7084:
            __assert_fail("type == Type::i64",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x129,"int64_t wasm::Literal::geti64() const");
          }
          uVar2 = *(uint *)(pcVar1 + 0x10) & 0x3f;
        }
        else {
          if (*(long *)(pcVar1 + 8) != 2) {
LAB_009d704d:
            handle_unreachable("unexpected type",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                               ,0x4a);
          }
          if (*(long *)(pcVar1 + 0x20) != 2) {
LAB_009d7065:
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x120,"int32_t wasm::Literal::geti32() const");
          }
          uVar2 = *(uint *)(pcVar1 + 0x10) & 0x1f;
        }
        *extraLeftShifts = uVar4 - uVar2;
        IVar3 = getSignExtBits(curr);
        return IVar3;
      }
    }
    pcVar5 = "T *wasm::Expression::cast() [T = wasm::Const]";
  }
  else {
    pcVar5 = "T *wasm::Expression::cast() [T = wasm::Binary]";
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,pcVar5);
}

Assistant:

inline Index getAlmostSignExtBits(Expression* curr, Index& extraLeftShifts) {
  auto* leftShift = curr->cast<Binary>()->left->cast<Binary>()->right;
  auto* rightShift = curr->cast<Binary>()->right;
  extraLeftShifts =
    Bits::getEffectiveShifts(leftShift) - Bits::getEffectiveShifts(rightShift);
  return getSignExtBits(curr);
}